

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode ExtensionObject_decodeBinary(UA_ExtensionObject *dst,UA_DataType *_)

{
  UA_StatusCode UVar1;
  void *pvVar2;
  UA_Byte UVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  UA_StatusCode UVar7;
  UA_DataType *pUVar8;
  undefined1 auStack_38 [8];
  UA_NodeId typeId;
  
  auStack_38 = (undefined1  [8])0x0;
  typeId.namespaceIndex = 0;
  typeId._2_2_ = 0;
  typeId.identifierType = UA_NODEIDTYPE_NUMERIC;
  typeId.identifier.string.length = 0;
  UVar1 = NodeId_decodeBinary((UA_NodeId *)auStack_38,_);
  UVar3 = '\0';
  uVar6 = 0x80070000;
  if (pos + 1 <= end) {
    UVar3 = *pos;
    uVar6 = 0;
    pos = pos + 1;
  }
  UVar7 = 0x80070000;
  if (auStack_38._4_4_ == UA_NODEIDTYPE_NUMERIC) {
    UVar7 = uVar6 | UVar1;
  }
  if (UVar7 == 0) {
    if (UVar3 == '\0') {
      dst->encoding = UA_EXTENSIONOBJECT_ENCODED_NOBODY;
      (dst->content).decoded.type = (UA_DataType *)auStack_38;
      (dst->content).decoded.data = (void *)typeId._0_8_;
      *(size_t *)((long)&dst->content + 0x10) = typeId.identifier.string.length;
      (dst->content).encoded.body.length = 0;
      (dst->content).encoded.body.data = (UA_Byte *)0x0;
      UVar7 = 0;
    }
    else {
      if (UVar3 == '\x02') {
        dst->encoding = UA_EXTENSIONOBJECT_ENCODED_XML;
LAB_00112ecb:
        (dst->content).decoded.type = (UA_DataType *)auStack_38;
        (dst->content).decoded.data = (void *)typeId._0_8_;
        *(size_t *)((long)&dst->content + 0x10) = typeId.identifier.string.length;
        UVar1 = Array_decodeBinary((void **)((long)&dst->content + 0x20),
                                   (size_t *)((long)&dst->content + 0x18),UA_TYPES + 2);
        return UVar1;
      }
      UVar7 = 0x80070000;
      if (UVar3 == '\x01') {
        pUVar8 = (UA_DataType *)0x0;
        lVar5 = 0;
        do {
          if (typeId._0_4_ == (uint)*(ushort *)((long)&UA_TYPES[0].binaryEncodingId + lVar5)) {
            pUVar8 = (UA_DataType *)((long)&UA_TYPES[0].typeName + lVar5);
            break;
          }
          lVar5 = lVar5 + 0x30;
        } while (lVar5 != 0x1e90);
        if (pUVar8 == (UA_DataType *)0x0) {
          dst->encoding = UA_EXTENSIONOBJECT_ENCODED_BYTESTRING;
          goto LAB_00112ecb;
        }
        pvVar2 = calloc(1,(ulong)pUVar8->memSize);
        (dst->content).decoded.data = pvVar2;
        if (pvVar2 != (void *)0x0) {
          pos = pos + 4;
          dst->encoding = UA_EXTENSIONOBJECT_DECODED;
          (dst->content).decoded.type = pUVar8;
          uVar4 = 0x19;
          if ((pUVar8->field_0x25 & 1) != 0) {
            uVar4 = (ulong)pUVar8->typeIndex;
          }
          UVar1 = (*decodeBinaryJumpTable[uVar4])(pvVar2,pUVar8);
          return UVar1;
        }
        UVar7 = 0x80030000;
      }
    }
  }
  else {
    deleteMembers_noInit(auStack_38,UA_TYPES + 0x10);
  }
  return UVar7;
}

Assistant:

static UA_StatusCode
ExtensionObject_decodeBinary(UA_ExtensionObject *dst, const UA_DataType *_) {
    UA_Byte encoding = 0;
    UA_NodeId typeId;
    UA_NodeId_init(&typeId);
    UA_StatusCode retval = NodeId_decodeBinary(&typeId, NULL);
    retval |= Byte_decodeBinary(&encoding, NULL);
    if(typeId.identifierType != UA_NODEIDTYPE_NUMERIC)
        retval = UA_STATUSCODE_BADDECODINGERROR;
    if(retval != UA_STATUSCODE_GOOD) {
        UA_NodeId_deleteMembers(&typeId);
        return retval;
    }

    if(encoding == UA_EXTENSIONOBJECT_ENCODED_BYTESTRING) {
        retval = ExtensionObject_decodeBinaryContent(dst, &typeId);
    } else if(encoding == UA_EXTENSIONOBJECT_ENCODED_NOBODY) {
        dst->encoding = (UA_ExtensionObjectEncoding)encoding;
        dst->content.encoded.typeId = typeId;
        dst->content.encoded.body = UA_BYTESTRING_NULL;
    } else if(encoding == UA_EXTENSIONOBJECT_ENCODED_XML) {
        dst->encoding = (UA_ExtensionObjectEncoding)encoding;
        dst->content.encoded.typeId = typeId;
        retval = ByteString_decodeBinary(&dst->content.encoded.body);
    } else {
        retval = UA_STATUSCODE_BADDECODINGERROR;
    }
    return retval;
}